

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::HydroProp::getCenterOfPitch(HydroProp *this)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  Vector<double,_3U> *v2;
  Vector3d *in_RDI;
  Vector<double,_3U> *v;
  Vector3d cop;
  Mat3x3d P;
  Vector<double,_3U> *v1;
  Vector<double,_3U> local_70;
  RectMatrix<double,_3U,_3U> local_58;
  
  getPitchMatrix((HydroProp *)cop.super_Vector<double,_3U>.data_[0]);
  Vector3<double>::Vector3((Vector3<double> *)0x3ad1a1);
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_58,1,2);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_58,2,1);
  dVar2 = *pdVar3;
  pdVar3 = Vector<double,_3U>::operator[](&local_70,0);
  *pdVar3 = (dVar1 - dVar2) * 0.5;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_58,2,0);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_58,0,2);
  dVar2 = *pdVar3;
  pdVar3 = Vector<double,_3U>::operator[](&local_70,1);
  *pdVar3 = (dVar1 - dVar2) * 0.5;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_58,0,1);
  v1 = (Vector<double,_3U> *)*pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_58,1,0);
  v = (Vector<double,_3U> *)(((double)v1 - *pdVar3) * 0.5);
  v2 = (Vector<double,_3U> *)Vector<double,_3U>::operator[](&local_70,2);
  v2->data_[0] = (double)v;
  OpenMD::operator+(v1,v2);
  Vector3<double>::Vector3((Vector3<double> *)v2,v);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3ad39e);
  return in_RDI;
}

Assistant:

Vector3d HydroProp::getCenterOfPitch() {
    Mat3x3d P = getPitchMatrix();
    Vector3d cop;
    cop[0] = 0.5 * (P(1, 2) - P(2, 1));
    cop[1] = 0.5 * (P(2, 0) - P(0, 2));
    cop[2] = 0.5 * (P(0, 1) - P(1, 0));
    // Assume Xi_ was stored at center of resistance, so center of
    // pitch is returned relative to origin if center of resistance is
    // not the origin:
    return (cor_ + cop);
  }